

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O3

void pzgeom::TPZQuadraticPyramid::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  MEM_CPY<double> *this;
  int i;
  long lVar2;
  Fad<double> *pFVar3;
  ulong uVar4;
  Fad<double> *pFVar5;
  long lVar6;
  double dVar7;
  undefined8 uVar8;
  Fad<double> eta;
  Fad<double> qsi;
  Fad<double> check;
  Fad<double> zeta;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  local_270;
  FadCst<int> *local_258;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> local_250;
  FadCst<int> local_238;
  FadCst<int> local_230;
  FadCst<int> local_228;
  undefined1 local_220 [8];
  FadCst<int> local_218;
  FadCst<int> local_210;
  undefined1 local_208 [16];
  FadCst<int> local_1f8;
  FadCst<int> local_1f0;
  FadCst<int> local_1e8;
  undefined1 local_1e0 [8];
  FadCst<int> local_1d8;
  FadCst<int> local_1d0;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  local_1c8;
  FadCst<int> local_1b8;
  undefined1 local_1b0 [8];
  Vector<double> local_1a8;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
  *local_198;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
  local_190;
  Fad<double> local_170;
  Fad<double> local_150;
  undefined1 local_130 [16];
  Fad<double> *local_120;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  *local_118;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *local_110;
  Fad<double> **local_108;
  FadCst<int> local_100;
  FadCst<int> local_f8;
  FadCst<int> local_f0;
  FadCst<int> local_e8;
  FadCst<int> local_e0;
  FadCst<int> *local_d8;
  FadCst<int> *local_d0;
  FadCst<int> local_c8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  local_c0;
  Fad<double> *local_b0;
  Fad<double> *local_a8;
  FadCst<int> local_a0;
  FadCst<int> local_98;
  undefined1 *local_90;
  double local_88;
  undefined8 uStack_80;
  Fad<double> local_70;
  Fad<double> local_50;
  
  pFVar3 = par->fStore;
  local_150.val_ = pFVar3->val_;
  uVar1 = (pFVar3->dx_).num_elts;
  local_150.dx_.ptr_to_data = (double *)0x0;
  pFVar5 = pFVar3;
  local_150.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = (long)(int)uVar1 << 3;
    }
    local_150.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_150.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(pFVar3->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
    pFVar5 = par->fStore;
  }
  local_150.defaultVal = pFVar3->defaultVal;
  local_170.val_ = pFVar5[1].val_;
  uVar1 = pFVar5[1].dx_.num_elts;
  local_170.dx_.ptr_to_data = (double *)0x0;
  pFVar3 = pFVar5;
  local_170.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = (long)(int)uVar1 * 8;
    }
    local_170.dx_.ptr_to_data = (double *)operator_new__(uVar4);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_170.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)pFVar5[1].dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
    pFVar3 = par->fStore;
  }
  local_170.defaultVal = pFVar5[1].defaultVal;
  local_70.val_ = pFVar3[2].val_;
  uVar8 = 0;
  uVar1 = pFVar3[2].dx_.num_elts;
  lVar6 = (long)(int)uVar1;
  local_50.dx_.ptr_to_data = (double *)0x0;
  local_50.val_ = local_70.val_;
  local_50.dx_.num_elts = uVar1;
  if (lVar6 == 0) {
    this = (MEM_CPY<double> *)0x0;
  }
  else {
    uStack_80 = 0;
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = lVar6 * 8;
    }
    local_88 = local_70.val_;
    this = (MEM_CPY<double> *)operator_new__(uVar4);
    local_50.dx_.ptr_to_data = (double *)this;
    MEM_CPY<double>::copy
              (this,(EVP_PKEY_CTX *)pFVar3[2].dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
    local_70.val_ = local_88;
    uVar8 = uStack_80;
  }
  local_50.defaultVal = pFVar3[2].defaultVal;
  local_70.val_ = local_70.val_ + -1.0;
  local_70.dx_.num_elts = 0;
  local_70.dx_.ptr_to_data = (double *)0x0;
  dVar7 = local_70.val_;
  if (0 < (int)uVar1) {
    local_88 = local_70.val_;
    uStack_80 = uVar8;
    local_70.dx_.num_elts = uVar1;
    local_70.dx_.ptr_to_data = (double *)operator_new__(lVar6 * 8);
    lVar2 = 0;
    do {
      local_70.dx_.ptr_to_data[lVar2] = *(double *)(this + lVar2 * 8);
      lVar2 = lVar2 + 1;
      dVar7 = local_88;
    } while (lVar6 != lVar2);
  }
  local_70.defaultVal = 0.0;
  if (1e-06 <= ABS(dVar7)) {
    local_208._0_8_ = local_1b0;
    local_1a8.num_elts = 1;
    local_1a8._4_4_ = 0;
    local_228 = (FadCst<int>)&local_170;
    local_250.fadexpr_.right_ = &local_150;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_1f0 = (FadCst<int>)&local_190;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_190.fadexpr_.left_.defaultVal = (double)&local_250;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_1d8 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_258 = (FadCst<int> *)local_220;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_270;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_210 = (FadCst<int>)&local_50;
    local_208._8_8_ = local_250.fadexpr_.right_;
    local_1f8 = (FadCst<int>)local_208;
    local_1a8.ptr_to_data = (double *)local_228;
    local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    local_190.fadexpr_.left_.constant_ = (double)&local_50;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_50;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (phi->fElem,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_1a8.num_elts = 1;
    local_1a8._4_4_ = 0;
    local_250.fadexpr_.right_ = &local_170;
    local_208._0_8_ = local_1b0;
    local_228 = (FadCst<int>)&local_150;
    local_230.constant_ = 1;
    local_230.defaultVal = 0;
    local_1f0 = (FadCst<int>)&local_190;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_190.fadexpr_.left_.defaultVal = (double)&local_250;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_1d8 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_130;
    local_130._0_8_ = local_1e0;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)local_220;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_270;
    local_208._8_8_ = local_228;
    local_1a8.ptr_to_data = &(local_250.fadexpr_.right_)->val_;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_210 = (FadCst<int>)&local_50;
      local_1f8 = (FadCst<int>)local_208;
      local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
      local_190.fadexpr_.left_.constant_ = (double)&local_50;
      local_190.fadexpr_.right_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
            *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_210 = (FadCst<int>)&local_50;
    local_1f8 = (FadCst<int>)local_208;
    local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    local_190.fadexpr_.left_.constant_ = (double)&local_50;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_230.constant_ = 1;
    local_230.defaultVal = 0;
    local_250.fadexpr_.left_.constant_ = 1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_228 = (FadCst<int>)&local_170;
    local_208._0_8_ = local_1b0;
    local_250.fadexpr_.right_ = &local_150;
    local_1f0 = (FadCst<int>)&local_190;
    local_190.fadexpr_.left_.defaultVal = (double)&local_250;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_1d8 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_130._0_8_ = local_1e0;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)local_220;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_130;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_270;
    local_208._8_8_ = local_250.fadexpr_.right_;
    local_1a8.ptr_to_data = (double *)local_228;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_210 = (FadCst<int>)&local_50;
      local_1f8 = (FadCst<int>)local_208;
      local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
      local_190.fadexpr_.left_.constant_ = (double)&local_50;
      local_190.fadexpr_.right_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
            *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_210 = (FadCst<int>)&local_50;
    local_1f8 = (FadCst<int>)local_208;
    local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    local_190.fadexpr_.left_.constant_ = (double)&local_50;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_228 = (FadCst<int>)&local_170;
    local_208._0_8_ = local_1b0;
    local_250.fadexpr_.right_ = &local_150;
    local_230.constant_ = 1;
    local_230.defaultVal = 0;
    local_1f0 = (FadCst<int>)&local_190;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_190.fadexpr_.left_.defaultVal = (double)&local_250;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_1d8 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)local_220;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_270;
    local_208._8_8_ = local_250.fadexpr_.right_;
    local_1a8.ptr_to_data = (double *)local_228;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_210 = (FadCst<int>)&local_50;
      local_1f8 = (FadCst<int>)local_208;
      local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
      local_190.fadexpr_.left_.constant_ = (double)&local_50;
      local_190.fadexpr_.right_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
            *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_210 = (FadCst<int>)&local_50;
    local_1f8 = (FadCst<int>)local_208;
    local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    local_190.fadexpr_.left_.constant_ = (double)&local_50;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 3,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_1a8.num_elts = 2;
    local_1a8._4_4_ = 0;
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)local_1b0;
    local_230 = (FadCst<int>)&local_270;
    local_238 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (phi->fElem + 4,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_238);
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_1a8.ptr_to_data = &local_170.val_;
    local_208._0_8_ = local_1b0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250.fadexpr_.right_ = &local_150;
    local_1f0 = (FadCst<int>)&local_190;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_190.fadexpr_.left_.defaultVal = (double)&local_250;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_1d8 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)local_220;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_270;
    local_228 = (FadCst<int>)local_250.fadexpr_.right_;
    local_208._8_8_ = &local_50;
    local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 6) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_210 = (FadCst<int>)&local_50;
      local_1f8 = (FadCst<int>)local_208;
      local_190.fadexpr_.left_.constant_ = (double)&local_50;
      local_190.fadexpr_.right_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
            *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_210 = (FadCst<int>)&local_50;
    local_1f8 = (FadCst<int>)local_208;
    local_190.fadexpr_.left_.constant_ = (double)&local_50;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 5,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_228 = (FadCst<int>)&local_170;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_190._0_8_ = &local_238;
    local_1f0 = (FadCst<int>)&local_190;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_250.fadexpr_.right_ = &local_150;
    local_190.fadexpr_.left_.defaultVal = (double)&local_250;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_1d8 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)local_220;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_270;
    local_208._0_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)local_1b0;
    local_1a8.ptr_to_data = (double *)local_228;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 7) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_210 = (FadCst<int>)&local_50;
      local_208._8_8_ = &local_50;
      local_1f8 = (FadCst<int>)local_208;
      local_190.fadexpr_.left_.constant_ = (double)&local_50;
      local_190.fadexpr_.right_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
            *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_210 = (FadCst<int>)&local_50;
    local_208._8_8_ = &local_50;
    local_1f8 = (FadCst<int>)local_208;
    local_190.fadexpr_.left_.constant_ = (double)&local_50;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 6,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_208._0_8_ = &local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_190.fadexpr_.left_.constant_ = (double)&local_238;
    local_1f0 = (FadCst<int>)&local_190;
    local_250.fadexpr_.left_.constant_ = 1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_250.fadexpr_.right_ = &local_170;
    local_190.fadexpr_.left_.defaultVal = (double)&local_250;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_1d8 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)local_220;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_270;
    local_228 = (FadCst<int>)&local_50;
    local_208._8_8_ = local_208._0_8_;
    local_190._0_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)local_1b0;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 8) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_210 = (FadCst<int>)&local_50;
      local_1f8 = (FadCst<int>)local_208;
      local_1a8.ptr_to_data = &local_50.val_;
      local_190.fadexpr_.right_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
            *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_210 = (FadCst<int>)&local_50;
    local_1f8 = (FadCst<int>)local_208;
    local_1a8.ptr_to_data = &local_50.val_;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 7,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_208._0_8_ = &local_170;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_1f8 = (FadCst<int>)local_130;
    local_1f0 = (FadCst<int>)&local_190;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_250.fadexpr_.right_ = &local_150;
    local_190.fadexpr_.left_.defaultVal = (double)&local_250;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_1d8 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)local_220;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_270;
    local_208._8_8_ = local_208._0_8_;
    local_190.fadexpr_.left_.constant_ = (double)&local_238;
    local_130._0_8_ = (Fad<double> *)local_208;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 9) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      local_190._0_8_ =
           (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
            *)local_1b0;
      local_190.fadexpr_.right_ =
           (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
            *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    local_190._0_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)local_1b0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 8,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_1e0 = (undefined1  [8])&local_270;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_1a8.ptr_to_data = &local_150.val_;
    local_1f8 = (FadCst<int>)local_1b0;
    local_218 = (FadCst<int>)&local_1f8;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250._0_8_ = local_220;
    local_208._0_8_ = &local_250;
    local_250.fadexpr_.left_ = (FadCst<int>)&local_238;
    local_220 = (undefined1  [8])&local_1c8;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_50;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 10) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_228 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_228 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 9,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_208);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_1e0 = (undefined1  [8])&local_270;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_1a8.ptr_to_data = &local_150.val_;
    local_1f8 = (FadCst<int>)local_1b0;
    local_218 = (FadCst<int>)&local_1f8;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250._0_8_ = local_220;
    local_208._0_8_ = &local_250;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xb) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_250.fadexpr_.left_ = (FadCst<int>)&local_238;
      local_228 = (FadCst<int>)&local_50;
      local_220 = (undefined1  [8])&local_1c8;
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.left_ = (FadCst<int>)&local_238;
    local_228 = (FadCst<int>)&local_50;
    local_220 = (undefined1  [8])&local_1c8;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 10,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_208);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_1e0 = (undefined1  [8])&local_270;
    local_1a8.num_elts = 1;
    local_1a8._4_4_ = 0;
    local_1a8.ptr_to_data = &local_150.val_;
    local_1f8 = (FadCst<int>)local_1b0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_230.constant_ = 1;
    local_230.defaultVal = 0;
    local_250._0_8_ = local_220;
    local_218 = (FadCst<int>)&local_50;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xc) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_250.fadexpr_.left_ = (FadCst<int>)&local_238;
      local_228 = (FadCst<int>)&local_50;
      local_220 = (undefined1  [8])&local_1c8;
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.left_ = (FadCst<int>)&local_238;
    local_228 = (FadCst<int>)&local_50;
    local_220 = (undefined1  [8])&local_1c8;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 0xb,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_250);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_1e0 = (undefined1  [8])&local_270;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_1a8.ptr_to_data = &local_150.val_;
    local_220 = (undefined1  [8])&local_1c8;
    local_218 = (FadCst<int>)&local_1f8;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250._0_8_ = local_220;
    local_250.fadexpr_.left_ = (FadCst<int>)&local_238;
    local_208._0_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_250;
    local_1f8 = (FadCst<int>)local_1b0;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xd) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_228 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_228 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_50;
    Fad<double>::operator=
              (phi->fElem + 0xc,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_208);
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_208._0_8_ = &local_170;
    local_230.constant_ = 2;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)&local_150;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    local_218 = (FadCst<int>)&local_270;
    local_250.fadexpr_.right_ = &local_50;
    local_220 = (undefined1  [8])&local_1c8;
    local_208._8_8_ = &local_238;
    local_1f8 = (FadCst<int>)local_208;
    local_1e0 = (undefined1  [8])local_1b0;
    local_1a8.ptr_to_data = (double *)local_208._0_8_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_208._8_8_ = &local_150;
    local_1e0 = (undefined1  [8])local_1b0;
    local_230.constant_ = 2;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)&local_170;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    local_218 = (FadCst<int>)&local_270;
    local_208._0_8_ = &local_238;
    local_1a8.ptr_to_data = (double *)local_208._8_8_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_250.fadexpr_.right_ = &local_50;
      local_220 = (undefined1  [8])&local_1c8;
      local_1f8 = (FadCst<int>)local_208;
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_220 = (undefined1  [8])&local_1c8;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_130._0_8_ = &local_b0;
    local_c0.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_170;
    local_250.fadexpr_.right_ = &local_150;
    local_d8 = &local_f0;
    local_d0 = &local_e0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_c8 = (FadCst<int>)&local_100;
    local_100 = (FadCst<int>)local_1b0;
    local_c0.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_d0;
    local_190.fadexpr_.right_ = &local_c0;
    local_190.fadexpr_.left_.defaultVal = (double)local_130;
    local_250.fadexpr_.left_.constant_ = 1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0xffffffff;
    local_108 = &local_120;
    local_190.fadexpr_.left_.constant_ = (double)&local_110;
    local_110 = &local_250;
    local_190._0_8_ = &local_190.fadexpr_.left_.defaultVal;
    local_208._0_8_ = &local_a0;
    local_a0 = (FadCst<int>)&local_190;
    local_1d8.constant_ = -1;
    local_1d8.defaultVal = 0;
    local_1f0.constant_ = -1;
    local_1f0.defaultVal = 0;
    local_98 = (FadCst<int>)local_1e0;
    local_90 = (undefined1 *)&local_1f8;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_208._8_8_ = &local_270;
    local_258 = &local_98;
    local_1e8 = (FadCst<int>)&local_50;
    local_1d0 = (FadCst<int>)&local_50;
    local_1b8 = (FadCst<int>)&local_50;
    local_130._8_8_ = local_250.fadexpr_.right_;
    local_120 = (Fad<double> *)local_220;
    local_118 = &local_1c8;
    local_f8 = (FadCst<int>)&local_238;
    local_f0 = (FadCst<int>)local_250.fadexpr_.right_;
    local_e8 = (FadCst<int>)local_250.fadexpr_.right_;
    local_e0 = (FadCst<int>)local_250.fadexpr_.right_;
    local_b0 = (Fad<double> *)local_c0.fadexpr_.left_;
    local_a8 = (Fad<double> *)local_c0.fadexpr_.left_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)local_208);
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_208._0_8_ = &local_170;
    local_230.constant_ = 2;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)&local_150;
    local_208._8_8_ = &local_238;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_190._0_8_ = &local_1c8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    local_220 = (undefined1  [8])&local_190;
    local_218 = (FadCst<int>)&local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_1f8 = (FadCst<int>)local_208;
    local_1e0 = (undefined1  [8])local_1b0;
    local_1a8.ptr_to_data = (double *)local_208._0_8_;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      local_250.fadexpr_.right_ = &local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_1a8.num_elts = 1;
    local_1a8._4_4_ = 0;
    local_208._8_8_ = &local_150;
    local_88 = 2.12199578997714e-314;
    local_230.constant_ = -2;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)&local_170;
    local_208._0_8_ = &local_238;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    local_220 = (undefined1  [8])&local_1c8;
    local_218 = (FadCst<int>)&local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_1a8.ptr_to_data = (double *)local_208._8_8_;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      local_250.fadexpr_.right_ = &local_50;
      local_1f8 = (FadCst<int>)local_208;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e0 = (undefined1  [8])local_1b0;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e0 = (undefined1  [8])local_1b0;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_c0.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_170;
    local_130._0_8_ = &local_b0;
    local_250.fadexpr_.right_ = &local_150;
    local_d8 = &local_f0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_f8 = (FadCst<int>)&local_238;
    local_d0 = &local_e0;
    local_c8 = (FadCst<int>)&local_100;
    local_c0.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_d0;
    local_190.fadexpr_.left_.defaultVal = (double)local_130;
    local_190.fadexpr_.right_ = &local_c0;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0xffffffff;
    local_118 = &local_1c8;
    local_110 = &local_250;
    local_108 = &local_120;
    local_190._0_8_ = &local_190.fadexpr_.left_.defaultVal;
    local_190.fadexpr_.left_.constant_ = (double)&local_110;
    local_1d8.constant_ = -1;
    local_1d8.defaultVal = 0;
    local_1f0.constant_ = -1;
    local_1f0.defaultVal = 0;
    local_98 = (FadCst<int>)local_1e0;
    local_90 = (undefined1 *)&local_1f8;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_208._0_8_ = &local_190;
    local_208._8_8_ = &local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_130._8_8_ = local_250.fadexpr_.right_;
    local_120 = (Fad<double> *)local_220;
    local_100 = (FadCst<int>)local_1b0;
    local_f0 = (FadCst<int>)local_250.fadexpr_.right_;
    local_e8 = (FadCst<int>)local_250.fadexpr_.right_;
    local_e0 = (FadCst<int>)local_250.fadexpr_.right_;
    local_b0 = (Fad<double> *)local_c0.fadexpr_.left_;
    local_a8 = (Fad<double> *)local_c0.fadexpr_.left_;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      local_258 = &local_98;
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      local_1e8 = (FadCst<int>)&local_50;
      local_1d0 = (FadCst<int>)&local_50;
      local_1b8 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_258 = &local_98;
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    local_1e8 = (FadCst<int>)&local_50;
    local_1d0 = (FadCst<int>)&local_50;
    local_1b8 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)local_208);
    local_1a8.num_elts = 1;
    local_1a8._4_4_ = 0;
    local_208._0_8_ = &local_170;
    local_230.constant_ = 2;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)&local_150;
    local_208._8_8_ = &local_238;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_190._0_8_ = &local_1c8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    local_220 = (undefined1  [8])&local_190;
    local_218 = (FadCst<int>)&local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_1f8 = (FadCst<int>)local_208;
    local_1a8.ptr_to_data = (double *)local_208._0_8_;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      local_250.fadexpr_.right_ = &local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e0 = (undefined1  [8])local_1b0;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e0 = (undefined1  [8])local_1b0;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_1a8.num_elts = 1;
    local_1a8._4_4_ = 0;
    local_208._8_8_ = &local_150;
    local_230.constant_ = 2;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)&local_170;
    local_208._0_8_ = &local_238;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_190._0_8_ = &local_1c8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    local_220 = (undefined1  [8])&local_190;
    local_218 = (FadCst<int>)&local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_1a8.ptr_to_data = (double *)local_208._8_8_;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      local_250.fadexpr_.right_ = &local_50;
      local_1f8 = (FadCst<int>)local_208;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e0 = (undefined1  [8])local_1b0;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e0 = (undefined1  [8])local_1b0;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 2 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_c0.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_170;
    local_130._0_8_ = &local_b0;
    local_250.fadexpr_.right_ = &local_150;
    local_e0 = (FadCst<int>)&local_a0;
    local_d8 = &local_f0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_f8 = (FadCst<int>)&local_238;
    local_d0 = &local_e0;
    local_c8 = (FadCst<int>)&local_100;
    local_c0.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_d0;
    local_190.fadexpr_.left_.defaultVal = (double)local_130;
    local_190.fadexpr_.right_ = &local_c0;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0xffffffff;
    local_118 = &local_1c8;
    local_110 = &local_250;
    local_108 = &local_120;
    local_190._0_8_ = &local_190.fadexpr_.left_.defaultVal;
    local_190.fadexpr_.left_.constant_ = (double)&local_110;
    local_1d8.constant_ = -1;
    local_1d8.defaultVal = 0;
    local_1f0.constant_ = -1;
    local_1f0.defaultVal = 0;
    local_98 = (FadCst<int>)local_1e0;
    local_90 = (undefined1 *)&local_1f8;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_208._0_8_ = &local_190;
    local_208._8_8_ = &local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_130._8_8_ = local_250.fadexpr_.right_;
    local_120 = (Fad<double> *)local_220;
    local_f0 = (FadCst<int>)local_250.fadexpr_.right_;
    local_e8 = (FadCst<int>)local_250.fadexpr_.right_;
    local_b0 = (Fad<double> *)local_c0.fadexpr_.left_;
    local_a8 = (Fad<double> *)local_c0.fadexpr_.left_;
    local_a0 = (FadCst<int>)local_250.fadexpr_.right_;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      local_258 = &local_98;
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      local_1e8 = (FadCst<int>)&local_50;
      local_1d0 = (FadCst<int>)&local_50;
      local_1b8 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      local_100 = (FadCst<int>)local_1b0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_258 = &local_98;
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    local_1e8 = (FadCst<int>)&local_50;
    local_1d0 = (FadCst<int>)&local_50;
    local_1b8 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    local_100 = (FadCst<int>)local_1b0;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 2 + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)local_208);
    local_1a8.num_elts = 1;
    local_1a8._4_4_ = 0;
    local_208._0_8_ = &local_170;
    local_230.constant_ = 2;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)&local_150;
    local_208._8_8_ = &local_238;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    local_220 = (undefined1  [8])&local_1c8;
    local_218 = (FadCst<int>)&local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_1f8 = (FadCst<int>)local_208;
    local_1a8.ptr_to_data = (double *)local_208._0_8_;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      local_250.fadexpr_.right_ = &local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e0 = (undefined1  [8])local_1b0;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e0 = (undefined1  [8])local_1b0;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 3,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_1a8.num_elts = 2;
    local_1a8._4_4_ = 0;
    local_1a8.ptr_to_data = &local_170.val_;
    local_228 = (FadCst<int>)&local_150;
    local_1e0 = (undefined1  [8])&local_1f8;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_208._0_8_ = &local_238;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_220 = (undefined1  [8])&local_1c8;
    local_218 = (FadCst<int>)&local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_258 = (FadCst<int> *)&local_250;
    local_1f8 = (FadCst<int>)local_1b0;
    local_1f0 = local_228;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_208;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      local_250.fadexpr_.right_ = &local_50;
      local_208._8_8_ = &local_50;
      local_1d8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_208._8_8_ = &local_50;
    local_1d8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 3 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_130._0_8_ = &local_b0;
    local_a0 = (FadCst<int>)local_130;
    local_250.fadexpr_.right_ = &local_150;
    local_d8 = &local_f0;
    local_d0 = &local_e0;
    local_c8 = (FadCst<int>)&local_100;
    local_c0.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_170;
    local_c0.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_d0;
    local_190.fadexpr_.left_.defaultVal = (double)&local_a0;
    local_190.fadexpr_.right_ = &local_c0;
    local_118 = &local_1c8;
    local_108 = &local_120;
    local_190._0_8_ = &local_190.fadexpr_.left_.defaultVal;
    local_190.fadexpr_.left_.constant_ = (double)&local_110;
    local_270.fadexpr_.right_.constant_ = 4.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = &local_98;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250.fadexpr_.left_.constant_ = 1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0xffffffff;
    local_1d8.constant_ = -1;
    local_1d8.defaultVal = 0;
    local_1f0.constant_ = -1;
    local_1f0.defaultVal = 0;
    local_98 = (FadCst<int>)local_1e0;
    local_90 = (undefined1 *)&local_1f8;
    local_208._0_8_ = &local_190;
    local_208._8_8_ = &local_270;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_130._8_8_ = local_250.fadexpr_.right_;
    local_120 = (Fad<double> *)local_220;
    local_110 = &local_250;
    local_f8 = (FadCst<int>)&local_238;
    local_f0 = (FadCst<int>)local_250.fadexpr_.right_;
    local_e8 = (FadCst<int>)local_250.fadexpr_.right_;
    local_e0 = (FadCst<int>)local_250.fadexpr_.right_;
    local_b0 = (Fad<double> *)local_c0.fadexpr_.left_;
    local_a8 = (Fad<double> *)local_c0.fadexpr_.left_;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      local_1e8 = (FadCst<int>)&local_50;
      local_1d0 = (FadCst<int>)&local_50;
      local_1b8 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      local_100 = (FadCst<int>)local_1b0;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    local_1e8 = (FadCst<int>)&local_50;
    local_1d0 = (FadCst<int>)&local_50;
    local_1b8 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    local_100 = (FadCst<int>)local_1b0;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 3 + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)local_208);
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 4].val_ = 0.0;
    if (pFVar3[lVar6 * 4].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 4].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 4 + 1].val_ = 0.0;
    if (pFVar3[lVar6 * 4 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 4 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    local_1a8.num_elts = 4;
    local_1a8._4_4_ = 0;
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)local_1b0;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 4 + 2,
               (FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_270);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_250._0_8_ = &local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_238 = (FadCst<int>)&local_250;
    local_230 = (FadCst<int>)local_1b0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_220 = (undefined1  [8])&local_270;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 5,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_1e0 = (undefined1  [8])&local_150;
    local_208._0_8_ = local_1e0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_1f0 = (FadCst<int>)&local_238;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_208;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_220 = (undefined1  [8])&local_1c8;
    local_218 = (FadCst<int>)&local_270;
    local_1f8 = (FadCst<int>)local_1b0;
    local_1d8 = (FadCst<int>)local_1e0;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 5 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_1a8._0_8_ = local_88;
    local_208._0_8_ = &local_170;
    local_190._0_8_ = &local_150;
    local_208._8_8_ = &local_190;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_190.fadexpr_.left_.defaultVal = (double)&local_238;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_250;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_1d8 = (FadCst<int>)&local_1f8;
    local_218.constant_ = 2;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_270.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_1c8;
    local_1e0 = (undefined1  [8])local_1b0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_220;
    local_1a8.ptr_to_data = (double *)local_208._0_8_;
    local_190.fadexpr_.left_.constant_ = (double)local_190._0_8_;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 5 + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)&local_270);
    local_1e0 = (undefined1  [8])&local_170;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_1f0 = (FadCst<int>)&local_238;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_218 = (FadCst<int>)&local_270;
    local_1d8 = (FadCst<int>)local_1e0;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_220 = (undefined1  [8])&local_1c8;
      local_1f8 = (FadCst<int>)local_1b0;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_220 = (undefined1  [8])&local_1c8;
    local_1f8 = (FadCst<int>)local_1b0;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 6,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_150;
    local_250._0_8_ = &local_170;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_238 = (FadCst<int>)&local_250;
    local_230 = (FadCst<int>)local_1b0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_220 = (undefined1  [8])&local_270;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 6 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_238);
    local_208._0_8_ = &local_170;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_190._0_8_ = &local_250;
    local_1a8.num_elts = 0;
    local_1a8._4_4_ = 0x40000000;
    local_1a8.ptr_to_data = (double *)0x0;
    local_198 = &local_190;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)local_1b0;
    local_270.fadexpr_.right_.constant_ = -0.5;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = &local_1f8;
    local_1e0 = (undefined1  [8])&local_150;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)local_1e0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_208._8_8_ = local_208._0_8_;
    local_1d8 = (FadCst<int>)&local_270;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_50;
    local_190.fadexpr_.left_.constant_ = (double)local_220;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      local_250.fadexpr_.right_ = &local_50;
      local_210 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_210 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 6 + 2,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                *)&local_1c8);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_250._0_8_ = &local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_238 = (FadCst<int>)&local_250;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_230 = (FadCst<int>)local_1b0;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      local_250.fadexpr_.left_ = (FadCst<int>)local_220;
      local_220 = (undefined1  [8])&local_270;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_220 = (undefined1  [8])&local_270;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 7,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_238);
    local_1e0 = (undefined1  [8])&local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_220 = (undefined1  [8])&local_1c8;
    local_218 = (FadCst<int>)&local_270;
    local_1f8 = (FadCst<int>)local_1b0;
    local_1f0 = (FadCst<int>)&local_238;
    local_1d8 = (FadCst<int>)local_1e0;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 7 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_208._0_8_ = &local_150;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_218.constant_ = -1;
    local_218.defaultVal = 0;
    local_190._0_8_ = &local_250;
    local_1a8.num_elts = 0;
    local_1a8._4_4_ = 0x40000000;
    local_1a8.ptr_to_data = (double *)0x0;
    local_198 = &local_190;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)local_1b0;
    local_270.fadexpr_.right_.constant_ = -0.5;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = &local_1f8;
    local_1e0 = (undefined1  [8])&local_170;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_228 = (FadCst<int>)local_1e0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_208._8_8_ = local_208._0_8_;
    local_1d8 = (FadCst<int>)&local_270;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    local_190.fadexpr_.left_.constant_ = (double)local_220;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      local_250.fadexpr_.right_ = &local_50;
      local_210 = (FadCst<int>)&local_50;
      local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_210 = (FadCst<int>)&local_50;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_50;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 7 + 2,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                *)&local_1c8);
    local_1e0 = (undefined1  [8])&local_170;
    local_208._0_8_ = local_1e0;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_1f8 = (FadCst<int>)local_1b0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_208;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    local_258 = (FadCst<int> *)&local_250;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_220 = (undefined1  [8])&local_1c8;
    local_218 = (FadCst<int>)&local_270;
    local_1f0 = (FadCst<int>)&local_238;
    local_1d8 = (FadCst<int>)local_1e0;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 8,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_220);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_150;
    local_250._0_8_ = &local_170;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230 = (FadCst<int>)local_1b0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_238 = (FadCst<int>)&local_250;
    local_220 = (undefined1  [8])&local_270;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 8 + 1,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_1a8._0_8_ = local_88;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)&local_190.fadexpr_.left_.defaultVal;
    local_208._8_8_ = &local_150;
    local_190._0_8_ = &local_170;
    local_208._0_8_ = &local_190;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_190.fadexpr_.left_.defaultVal = (double)&local_238;
    local_1e0 = (undefined1  [8])local_1b0;
    local_1d8 = (FadCst<int>)&local_1f8;
    local_218.constant_ = 2;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_270.fadexpr_.right_.constant_ = 2.0;
    local_270.fadexpr_.right_.defaultVal = 0.0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_270.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_1c8;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_220;
    local_1a8.ptr_to_data = (double *)local_208._8_8_;
    local_190.fadexpr_.left_.constant_ = (double)local_190._0_8_;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_250;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    Fad<double>::operator=(dphi->fElem + lVar6 * 8 + 2,&local_270);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230 = (FadCst<int>)local_1b0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_250._0_8_ = &local_50;
    local_220 = (undefined1  [8])&local_270;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      local_250.fadexpr_.left_ = (FadCst<int>)local_220;
      local_238 = (FadCst<int>)&local_250;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_238 = (FadCst<int>)&local_250;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 9,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230 = (FadCst<int>)local_1b0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      local_250._0_8_ = &local_50;
      local_250.fadexpr_.left_ = (FadCst<int>)local_220;
      local_238 = (FadCst<int>)&local_250;
      local_220 = (undefined1  [8])&local_270;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250._0_8_ = &local_50;
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_238 = (FadCst<int>)&local_250;
    local_220 = (undefined1  [8])&local_270;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 9 + 1,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1c8);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_150;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_190._0_8_ = &local_238;
    local_208._8_8_ = &local_190;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_1a8.ptr_to_data = (double *)local_208;
    local_1f8 = (FadCst<int>)&local_170;
    local_1f0 = (FadCst<int>)local_1b0;
    local_1d8 = (FadCst<int>)&local_1f8;
    local_218.constant_ = 2;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_208._0_8_ = local_270.fadexpr_.right_.defaultVal;
    local_1e0 = (undefined1  [8])&local_270;
    local_190.fadexpr_.left_.constant_ = (double)&local_250;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_220;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_220;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 9 + 2,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_1c8);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230 = (FadCst<int>)local_1b0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      local_250._0_8_ = &local_50;
      local_250.fadexpr_.left_ = (FadCst<int>)local_220;
      local_238 = (FadCst<int>)&local_250;
      local_220 = (undefined1  [8])&local_270;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250._0_8_ = &local_50;
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_238 = (FadCst<int>)&local_250;
    local_220 = (undefined1  [8])&local_270;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 10,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_238);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230 = (FadCst<int>)local_1b0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_250._0_8_ = local_220;
    local_250.fadexpr_.left_ = (FadCst<int>)&local_50;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      local_238 = (FadCst<int>)&local_250;
      local_220 = (undefined1  [8])&local_270;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_238 = (FadCst<int>)&local_250;
    local_220 = (undefined1  [8])&local_270;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 10 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_238);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_150;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_250.fadexpr_.left_.constant_ = -1;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_190.fadexpr_.left_.constant_ = (double)&local_250;
    local_208._8_8_ = &local_190;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_1a8.ptr_to_data = (double *)local_208;
    local_1f8 = (FadCst<int>)&local_170;
    local_1f0 = (FadCst<int>)local_1b0;
    local_1d8 = (FadCst<int>)&local_1f8;
    local_218.constant_ = 2;
    local_218.defaultVal = 0;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_208._0_8_ = local_270.fadexpr_.right_.defaultVal;
    local_190._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_238;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_210 = (FadCst<int>)&local_50;
      local_1e0 = (undefined1  [8])&local_270;
      local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_220;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_210 = (FadCst<int>)&local_50;
    local_1e0 = (undefined1  [8])&local_270;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_220;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 10 + 2,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_1c8);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_238 = (FadCst<int>)&local_250;
    local_230 = (FadCst<int>)local_1b0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      local_250._0_8_ = &local_50;
      local_250.fadexpr_.left_ = (FadCst<int>)local_220;
      local_220 = (undefined1  [8])&local_270;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250._0_8_ = &local_50;
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_220 = (undefined1  [8])&local_270;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 0xb,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_238);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_238 = (FadCst<int>)&local_250;
    local_230 = (FadCst<int>)local_1b0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      local_250._0_8_ = &local_50;
      local_250.fadexpr_.left_ = (FadCst<int>)local_220;
      local_220 = (undefined1  [8])&local_270;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250._0_8_ = &local_50;
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    local_220 = (undefined1  [8])&local_270;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 0xb + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_238);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_208._8_8_ = &local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_190._0_8_ = local_1b0;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)&local_190;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = 2;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_218 = (FadCst<int>)&local_250;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_220 = (undefined1  [8])&local_1c8;
    local_208._0_8_ = local_270.fadexpr_.right_.defaultVal;
    local_1d8 = (FadCst<int>)local_208._8_8_;
    local_190.fadexpr_.left_.constant_ = (double)&local_238;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_1e0 = (undefined1  [8])&local_270;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_1e0 = (undefined1  [8])&local_270;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 0xb + 2,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_220);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_238 = (FadCst<int>)&local_250;
    local_230 = (FadCst<int>)local_1b0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_250._0_8_ = local_220;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      local_250.fadexpr_.left_ = (FadCst<int>)&local_50;
      local_220 = (undefined1  [8])&local_270;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.left_ = (FadCst<int>)&local_50;
    local_220 = (undefined1  [8])&local_270;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 0xc,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_238);
    local_270.fadexpr_.right_.constant_ = 2.12199579047121e-314;
    local_270.fadexpr_.right_.defaultVal = (double)&local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_238 = (FadCst<int>)&local_250;
    local_230 = (FadCst<int>)local_1b0;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_250.fadexpr_.left_ = (FadCst<int>)local_220;
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      local_250._0_8_ = &local_50;
      local_220 = (undefined1  [8])&local_270;
      local_218 = (FadCst<int>)&local_50;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250._0_8_ = &local_50;
    local_220 = (undefined1  [8])&local_270;
    local_218 = (FadCst<int>)&local_50;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 0xc + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_238);
    local_270.fadexpr_.right_.constant_ = 4.94065645841247e-324;
    local_270.fadexpr_.right_.defaultVal = (double)&local_170;
    local_208._8_8_ = &local_150;
    local_1a8.num_elts = -1;
    local_1a8._4_4_ = 0;
    local_230.constant_ = -1;
    local_230.defaultVal = 0;
    local_190._0_8_ = local_1b0;
    local_1f8 = (FadCst<int>)local_208;
    local_1f0 = (FadCst<int>)&local_190;
    local_1c8.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1e0;
    local_1c8.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1f8;
    local_250.fadexpr_.left_.constant_ = 2;
    local_250.fadexpr_.left_.defaultVal = 0;
    local_218 = (FadCst<int>)&local_250;
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    local_208._0_8_ = local_270.fadexpr_.right_.defaultVal;
    local_1d8 = (FadCst<int>)local_208._8_8_;
    local_190.fadexpr_.left_.constant_ = (double)&local_238;
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      local_250.fadexpr_.right_ = &local_50;
      local_228 = (FadCst<int>)&local_50;
      local_220 = (undefined1  [8])&local_1c8;
      local_1e0 = (undefined1  [8])&local_270;
      local_1a8.ptr_to_data = &local_50.val_;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_250.fadexpr_.right_ = &local_50;
    local_228 = (FadCst<int>)&local_50;
    local_220 = (undefined1  [8])&local_1c8;
    local_1e0 = (undefined1  [8])&local_270;
    local_1a8.ptr_to_data = &local_50.val_;
    Fad<double>::operator=
              (dphi->fElem + lVar6 * 0xc + 2,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_220);
  }
  else {
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3->val_ = 0.0;
    if ((pFVar3->dx_).num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3->dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[1].val_ = 0.0;
    if (pFVar3[1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[1].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[2].val_ = 0.0;
    if (pFVar3[2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[2].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[3].val_ = 0.0;
    if (pFVar3[3].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[3].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[4].val_ = 1.0;
    if (pFVar3[4].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[4].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 6) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[5].val_ = 0.0;
    if (pFVar3[5].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[5].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 7) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[6].val_ = 0.0;
    if (pFVar3[6].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[6].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 8) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[7].val_ = 0.0;
    if (pFVar3[7].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[7].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 9) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[8].val_ = 0.0;
    if (pFVar3[8].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[8].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 10) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[9].val_ = 0.0;
    if (pFVar3[9].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[9].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xb) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[10].val_ = 0.0;
    if (pFVar3[10].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[10].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xc) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[0xb].val_ = 0.0;
    if (pFVar3[0xb].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[0xb].dx_,(double *)&local_270);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xd) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = phi->fElem;
    pFVar3[0xc].val_ = 0.0;
    if (pFVar3[0xc].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[0xc].dx_,(double *)&local_270);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3->val_ = 0.0;
    if ((pFVar3->dx_).num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3->dx_,(double *)&local_270);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[1].val_ = 0.0;
    if (pFVar3[1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[1].dx_,(double *)&local_270);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[2].val_ = -0.25;
    if (pFVar3[2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[2].dx_,(double *)&local_270);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6].val_ = 0.0;
    if (pFVar3[lVar6].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 + 1].val_ = 0.0;
    if (pFVar3[lVar6 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 + 2].val_ = -0.25;
    if (pFVar3[lVar6 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 2].val_ = 0.0;
    if (pFVar3[lVar6 * 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 2 + 1].val_ = 0.0;
    if (pFVar3[lVar6 * 2 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 2 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 2 + 2].val_ = -0.25;
    if (pFVar3[lVar6 * 2 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 2 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 3].val_ = 0.0;
    if (pFVar3[lVar6 * 3].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 3].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 3 + 1].val_ = 0.0;
    if (pFVar3[lVar6 * 3 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 3 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 3 + 2].val_ = -0.25;
    if (pFVar3[lVar6 * 3 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 3 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 4].val_ = 0.0;
    if (pFVar3[lVar6 * 4].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 4].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 4 + 1].val_ = 0.0;
    if (pFVar3[lVar6 * 4 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 4 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 4 + 2].val_ = 3.0;
    if (pFVar3[lVar6 * 4 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 4 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 5].val_ = 0.0;
    if (pFVar3[lVar6 * 5].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 5].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 5 + 1].val_ = 0.5;
    if (pFVar3[lVar6 * 5 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 5 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 5 + 2].val_ = 0.5;
    if (pFVar3[lVar6 * 5 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 5 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 6].val_ = -0.5;
    if (pFVar3[lVar6 * 6].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 6].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 6 + 1].val_ = 0.0;
    if (pFVar3[lVar6 * 6 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 6 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 6 + 2].val_ = 0.5;
    if (pFVar3[lVar6 * 6 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 6 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 7].val_ = 0.0;
    if (pFVar3[lVar6 * 7].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 7].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 7 + 1].val_ = -0.5;
    if (pFVar3[lVar6 * 7 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 7 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 7 + 2].val_ = 0.5;
    if (pFVar3[lVar6 * 7 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 7 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 8].val_ = 0.5;
    if (pFVar3[lVar6 * 8].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 8].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 8 + 1].val_ = 0.0;
    if (pFVar3[lVar6 * 8 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 8 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 8 + 2].val_ = 0.5;
    if (pFVar3[lVar6 * 8 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 8 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 9].val_ = -1.0;
    if (pFVar3[lVar6 * 9].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 9].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 9 + 1].val_ = -1.0;
    if (pFVar3[lVar6 * 9 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 9 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 9 + 2].val_ = -1.0;
    if (pFVar3[lVar6 * 9 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 9 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 10].val_ = 1.0;
    if (pFVar3[lVar6 * 10].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 10].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 10 + 1].val_ = -1.0;
    if (pFVar3[lVar6 * 10 + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 10 + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 10 + 2].val_ = -1.0;
    if (pFVar3[lVar6 * 10 + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 10 + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 0xb].val_ = 1.0;
    if (pFVar3[lVar6 * 0xb].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 0xb].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 0xb + 1].val_ = 1.0;
    if (pFVar3[lVar6 * 0xb + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 0xb + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 0xb + 2].val_ = -1.0;
    if (pFVar3[lVar6 * 0xb + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 0xb + 2].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 0xc].val_ = -1.0;
    if (pFVar3[lVar6 * 0xc].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 0xc].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 0xc + 1].val_ = 1.0;
    if (pFVar3[lVar6 * 0xc + 1].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 0xc + 1].dx_,(double *)&local_270);
      lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    }
    if ((lVar6 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar3 = dphi->fElem;
    pFVar3[lVar6 * 0xc + 2].val_ = -1.0;
    if (pFVar3[lVar6 * 0xc + 2].dx_.num_elts != 0) {
      local_270.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
            *)0x0;
      Vector<double>::operator=(&pFVar3[lVar6 * 0xc + 2].dx_,(double *)&local_270);
    }
  }
  Fad<double>::~Fad(&local_70);
  Fad<double>::~Fad(&local_50);
  Fad<double>::~Fad(&local_170);
  Fad<double>::~Fad(&local_150);
  return;
}

Assistant:

void TPZQuadraticPyramid::TShape(const TPZVec<T> &par,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = par[0], eta = par[1], zeta = par[2];
    T check = zeta-1.;
    if(fabs(check) < 1.E-6)
    {
        phi(0,0)  = 0.;
        phi(1,0)  = 0.;
        phi(2,0)  = 0.;
        phi(3,0)  = 0.;
        phi(4,0)  = 1.;
        phi(5,0)  = 0.;
        phi(6,0)  = 0.;
        phi(7,0)  = 0.;
        phi(8,0)  = 0.;
        phi(9,0)  = 0.;
        phi(10,0) = 0.;
        phi(11,0) = 0.;
        phi(12,0) = 0.;
        
        dphi(0,0) = 0.;
        dphi(1,0) = 0.;
        dphi(2,0) = -0.25;
        
        dphi(0,1) = 0.;
        dphi(1,1) = 0.;
        dphi(2,1) = -0.25;
        
        dphi(0,2) = 0.;
        dphi(1,2) = 0.;
        dphi(2,2) = -0.25;
        
        dphi(0,3) = 0.;
        dphi(1,3) = 0.;
        dphi(2,3) = -0.25;
        
        dphi(0,4) = 0.;
        dphi(1,4) = 0.;
        dphi(2,4) = 3.;
        
        dphi(0,5) = 0.;
        dphi(1,5) = 0.5;
        dphi(2,5) = 0.5;
        
        dphi(0,6) = -0.5;
        dphi(1,6) = 0.;
        dphi(2,6) = 0.5;
        
        dphi(0,7) = 0.;
        dphi(1,7) = -0.5;
        dphi(2,7) = 0.5;
        
        dphi(0,8) = 0.5;
        dphi(1,8) = 0.;
        dphi(2,8) = 0.5;
        
        dphi(0,9) = -1.;
        dphi(1,9) = -1.;
        dphi(2,9) = -1.;
        
        dphi(0,10) = 1.;
        dphi(1,10) = -1.;
        dphi(2,10) = -1.;
        
        dphi(0,11) = 1.;
        dphi(1,11) = 1.;
        dphi(2,11) = -1.;
        
        dphi(0,12) = -1;
        dphi(1,12) = 1.;
        dphi(2,12) = -1.;
        
        return;
    }

    phi(0,0) = ((1 + eta + qsi)*(-1 + eta + zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(1,0) = -((1 + eta - qsi)*(1 + qsi - zeta)*(-1 + eta + zeta))/(4.*(-1 + zeta));
    phi(2,0) = -((-1 + eta + qsi)*(1 + eta - zeta)*(1 + qsi - zeta))/(4.*(-1 + zeta));
    phi(3,0) = ((-1 + eta - qsi)*(1 + eta - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(4,0) = zeta*(-1 + 2*zeta);
    phi(5,0) = ((-1 + eta + zeta)*(-1 - qsi + zeta)*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(6,0) = ((-1 - eta + zeta)*(-1 + eta + zeta)*(-1 - qsi + zeta))/(2.*(-1 + zeta));
    phi(7,0) = ((qsi*qsi - (-1 + zeta)*(-1 + zeta))*(1 + eta - zeta))/(2.*(-1 + zeta));
    phi(8,0) = ((-(eta*eta) + (-1 + zeta)*(-1 + zeta))*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(9,0) = -((zeta*(-1 + eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));
    phi(10,0) = -((zeta*(-1 + eta + zeta)*(-1 - qsi + zeta))/(-1 + zeta));
    phi(11,0) = ((1 + eta - zeta)*(1 + qsi - zeta)*zeta)/(1 - zeta);
    phi(12,0) = -((zeta*(-1 - eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));


    dphi(0,0) = ((-1 + eta + zeta)*(eta + 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,0) = ((-1 + qsi + zeta)*(2*eta + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,0) = -(eta*eta*qsi + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,1) = -((-1 + eta + zeta)*(eta - 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,1) = ((1 + qsi - zeta)*(-2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,1) = (eta*eta*qsi + eta*(qsi - qsi*qsi + (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,2) = -((1 + eta - zeta)*(eta + 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,2) = -((1 + qsi - zeta)*(2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,2) = (eta*eta*qsi + eta*(-qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,3) = ((1 + eta - zeta)*(eta - 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,3) = ((2*eta - qsi - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,3) = (-(eta*eta*qsi) + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) + (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,4) = 0;
    dphi(1,4) = 0;
    dphi(2,4) = -1 + 4*zeta;

    dphi(0,5) = -((qsi*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,5) = (-(qsi*qsi) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,5) = (-2 + eta + (eta*(qsi*qsi))/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,6) = (eta*eta - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,6) = (eta*(1 + qsi - zeta))/(-1 + zeta);
    dphi(2,6) = -1 + qsi*(-0.5 - (eta*eta)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,7) = (qsi*(1 + eta - zeta))/(-1 + zeta);
    dphi(1,7) = (qsi*qsi - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,7) = -1 + eta*(-0.5 - (qsi*qsi)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,8) = (-(eta*eta) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,8) = -((eta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,8) = (-2 + qsi + (eta*eta*qsi)/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,9) = -((zeta*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,9) = -((zeta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,9) = 1 - qsi + eta*(-1 + qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,10) = (zeta*(-1 + eta + zeta))/(-1 + zeta);
    dphi(1,10) = ((1 + qsi - zeta)*zeta)/(-1 + zeta);
    dphi(2,10) = 1 + qsi + eta*(-1 - qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,11) = (zeta*(-1 - eta + zeta))/(-1 + zeta);
    dphi(1,11) = (zeta*(-1 - qsi + zeta))/(-1 + zeta);
    dphi(2,11) = 1 + eta + qsi + (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;

    dphi(0,12) = ((1 + eta - zeta)*zeta)/(-1 + zeta);
    dphi(1,12) = (zeta*(-1 + qsi + zeta))/(-1 + zeta);
    dphi(2,12) = 1 + eta - qsi - (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;
    
}